

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65694::CtorEvalExternalInterface::tableStore
          (CtorEvalExternalInterface *this,Name tableName,Address index,Literal *value)

{
  FailToEvalException *this_00;
  allocator<char> local_51;
  string local_50;
  Literal *local_30;
  Literal *value_local;
  CtorEvalExternalInterface *this_local;
  Address index_local;
  Name tableName_local;
  
  index_local.addr = tableName.super_IString.str._M_len;
  if ((this->instanceInitialized & 1U) != 0) {
    local_30 = value;
    value_local = (Literal *)this;
    this_local = (CtorEvalExternalInterface *)index.addr;
    this_00 = (FailToEvalException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"tableStore after init: TODO",&local_51);
    FailToEvalException::FailToEvalException(this_00,&local_50);
    __cxa_throw(this_00,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  return;
}

Assistant:

void
  tableStore(Name tableName, Address index, const Literal& value) override {
    // We allow stores to the table during initialization, but not after, as we
    // assume the table does not change at runtime.
    // TODO: Allow table changes by updating the table later like we do with the
    //       memory, by tracking and serializing them.
    if (instanceInitialized) {
      throw FailToEvalException("tableStore after init: TODO");
    }
  }